

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O1

Token * __thiscall llvm::yaml::Scanner::peekNext(Scanner *this)

{
  list_type *this_00;
  long *plVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint uVar3;
  bool bVar4;
  iterator I;
  Node *pNVar5;
  ilist_node_base<false> *piVar6;
  long *plVar7;
  long *plVar8;
  long lVar9;
  Token local_68;
  
  this_00 = &(this->TokenQueue).List;
  bVar4 = false;
  while ((((this_00->Sentinel).
           super_ilist_node_impl<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>_>
           .super_node_base_type.Prev != (ilist_node_base<false> *)this_00 && (!bVar4)) ||
         (bVar4 = fetchMoreTokens(this), bVar4))) {
    if ((this_00->Sentinel).
        super_ilist_node_impl<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>_>
        .super_node_base_type.Prev == (ilist_node_base<false> *)this_00) {
      __assert_fail("!TokenQueue.empty() && \"fetchMoreTokens lied about getting tokens!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/YAMLParser.cpp"
                    ,0x31e,"Token &llvm::yaml::Scanner::peekNext()");
    }
    removeStaleSimpleKeyCandidates(this);
    piVar6 = (this->TokenQueue).List.Sentinel.
             super_ilist_node_impl<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>_>
             .super_node_base_type.Next;
    plVar8 = (long *)(this->SimpleKeys).super_SmallVectorImpl<(anonymous_namespace)::SimpleKey>.
                     super_SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true>.
                     super_SmallVectorTemplateCommon<(anonymous_namespace)::SimpleKey,_void>.
                     super_SmallVectorBase.BeginX;
    uVar3 = (this->SimpleKeys).super_SmallVectorImpl<(anonymous_namespace)::SimpleKey>.
            super_SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true>.
            super_SmallVectorTemplateCommon<(anonymous_namespace)::SimpleKey,_void>.
            super_SmallVectorBase.Size;
    plVar1 = plVar8 + (ulong)uVar3 * 3;
    plVar7 = plVar8;
    if (3 < (ulong)uVar3) {
      plVar7 = plVar8 + (ulong)(uVar3 >> 2) * 0xc;
      lVar9 = (ulong)(uVar3 >> 2) + 1;
      plVar8 = plVar8 + 6;
      do {
        if ((ilist_node_base<false> *)plVar8[-6] == piVar6) {
          plVar8 = plVar8 + -6;
          goto LAB_001d0443;
        }
        if ((ilist_node_base<false> *)plVar8[-3] == piVar6) {
          plVar8 = plVar8 + -3;
          goto LAB_001d0443;
        }
        if ((ilist_node_base<false> *)*plVar8 == piVar6) goto LAB_001d0443;
        if ((ilist_node_base<false> *)plVar8[3] == piVar6) {
          plVar8 = plVar8 + 3;
          goto LAB_001d0443;
        }
        lVar9 = lVar9 + -1;
        plVar8 = plVar8 + 0xc;
      } while (1 < lVar9);
    }
    lVar9 = ((long)plVar1 - (long)plVar7 >> 3) * -0x5555555555555555;
    if (lVar9 == 1) {
LAB_001d03dd:
      plVar8 = plVar7;
      if ((ilist_node_base<false> *)*plVar7 != piVar6) {
        plVar8 = plVar1;
      }
    }
    else if (lVar9 == 2) {
LAB_001d03d4:
      plVar8 = plVar7;
      if ((ilist_node_base<false> *)*plVar7 != piVar6) {
        plVar7 = plVar7 + 3;
        goto LAB_001d03dd;
      }
    }
    else {
      plVar8 = plVar1;
      if ((lVar9 == 3) && (plVar8 = plVar7, (ilist_node_base<false> *)*plVar7 != piVar6)) {
        plVar7 = plVar7 + 3;
        goto LAB_001d03d4;
      }
    }
LAB_001d0443:
    if (plVar8 == plVar1) goto LAB_001d04e0;
    bVar4 = true;
  }
  for (I.NodePtr = (node_pointer)
                   (this->TokenQueue).List.Sentinel.
                   super_ilist_node_impl<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>_>
                   .super_node_base_type.Next; (list_type *)I.NodePtr != this_00;
      I = simple_ilist<llvm::AllocatorList<llvm::yaml::Token,llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,4096ul,4096ul>>::Node>
          ::
          eraseAndDispose<llvm::AllocatorList<llvm::yaml::Token,llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,4096ul,4096ul>>::Disposer>
                    ((simple_ilist<llvm::AllocatorList<llvm::yaml::Token,llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,4096ul,4096ul>>::Node>
                      *)this_00,I,(Disposer)&this->TokenQueue)) {
  }
  paVar2 = &local_68.Value.field_2;
  local_68.Range.Length = 0;
  local_68.Kind = TK_Error;
  local_68._4_4_ = 0;
  local_68.Range.Data = (char *)0x0;
  local_68.Value.field_2._8_8_ = 0;
  local_68.Value._M_string_length = 0;
  local_68.Value.field_2._M_allocated_capacity = 0;
  local_68.Value._M_dataplus._M_p = (pointer)paVar2;
  pNVar5 = AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
           ::create<llvm::yaml::Token>(&this->TokenQueue,&local_68);
  piVar6 = (this_00->Sentinel).
           super_ilist_node_impl<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>_>
           .super_node_base_type.Prev;
  (pNVar5->
  super_ilist_node<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node>
  ).
  super_ilist_node_impl<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>_>
  .super_node_base_type.Next = (ilist_node_base<false> *)this_00;
  (pNVar5->
  super_ilist_node<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node>
  ).
  super_ilist_node_impl<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>_>
  .super_node_base_type.Prev = piVar6;
  piVar6->Next = (ilist_node_base<false> *)pNVar5;
  (this_00->Sentinel).
  super_ilist_node_impl<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>_>
  .super_node_base_type.Prev = (ilist_node_base<false> *)pNVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.Value._M_dataplus._M_p != paVar2) {
    operator_delete(local_68.Value._M_dataplus._M_p,local_68.Value.field_2._M_allocated_capacity + 1
                   );
  }
  piVar6 = (this->TokenQueue).List.Sentinel.
           super_ilist_node_impl<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>_>
           .super_node_base_type.Next;
LAB_001d04e0:
  return (Token *)(piVar6 + 1);
}

Assistant:

Token &Scanner::peekNext() {
  // If the current token is a possible simple key, keep parsing until we
  // can confirm.
  bool NeedMore = false;
  while (true) {
    if (TokenQueue.empty() || NeedMore) {
      if (!fetchMoreTokens()) {
        TokenQueue.clear();
        TokenQueue.push_back(Token());
        return TokenQueue.front();
      }
    }
    assert(!TokenQueue.empty() &&
            "fetchMoreTokens lied about getting tokens!");

    removeStaleSimpleKeyCandidates();
    SimpleKey SK;
    SK.Tok = TokenQueue.begin();
    if (!is_contained(SimpleKeys, SK))
      break;
    else
      NeedMore = true;
  }
  return TokenQueue.front();
}